

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<unsigned_long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::IntCastToVarInt>>
               (unsigned_long *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  char *extraout_RDX;
  char *pcVar7;
  char *extraout_RDX_00;
  Vector *result;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  idx_t iVar11;
  ulong uVar12;
  string_t sVar13;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar10 = &(result_data->value).pointer.ptr;
    pcVar7 = (char *)count;
    for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
      sVar13 = IntToVarInt<unsigned_long>
                         ((duckdb *)dataptr,(Vector *)ldata[iVar11],(unsigned_long)pcVar7);
      pcVar7 = sVar13.value._8_8_;
      uVar4 = sVar13.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
      paVar1->length = (int)uVar4;
      paVar1->prefix[0] = (char)(uVar4 >> 0x20);
      paVar1->prefix[1] = (char)(uVar4 >> 0x28);
      paVar1->prefix[2] = (char)(uVar4 >> 0x30);
      paVar1->prefix[3] = (char)(uVar4 >> 0x38);
      *ppcVar10 = pcVar7;
      ppcVar10 = ppcVar10 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      pcVar7 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      pcVar7 = extraout_RDX_00;
    }
    uVar8 = 0;
    for (uVar6 = 0; uVar6 != count + 0x3f >> 6; uVar6 = uVar6 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar12 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar12 = count;
        }
LAB_007656ec:
        ppcVar10 = &result_data[uVar8].value.pointer.ptr;
        for (; uVar5 = uVar8, uVar8 < uVar12; uVar8 = uVar8 + 1) {
          sVar13 = IntToVarInt<unsigned_long>
                             ((duckdb *)dataptr,(Vector *)ldata[uVar8],(unsigned_long)pcVar7);
          pcVar7 = sVar13.value._8_8_;
          uVar4 = sVar13.value._0_8_;
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
          paVar1->length = (int)uVar4;
          paVar1->prefix[0] = (char)(uVar4 >> 0x20);
          paVar1->prefix[1] = (char)(uVar4 >> 0x28);
          paVar1->prefix[2] = (char)(uVar4 >> 0x30);
          paVar1->prefix[3] = (char)(uVar4 >> 0x38);
          *ppcVar10 = pcVar7;
          ppcVar10 = ppcVar10 + 2;
        }
      }
      else {
        uVar3 = puVar2[uVar6];
        uVar12 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar12 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_007656ec;
        uVar5 = uVar12;
        if (uVar3 != 0) {
          ppcVar10 = &result_data[uVar8].value.pointer.ptr;
          for (uVar9 = 0; uVar5 = uVar9 + uVar8, uVar9 + uVar8 < uVar12; uVar9 = uVar9 + 1) {
            if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
              sVar13 = IntToVarInt<unsigned_long>
                                 ((duckdb *)dataptr,(Vector *)ldata[uVar8 + uVar9],
                                  (unsigned_long)pcVar7);
              pcVar7 = sVar13.value._8_8_;
              uVar4 = sVar13.value._0_8_;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
              paVar1->length = (int)uVar4;
              paVar1->prefix[0] = (char)(uVar4 >> 0x20);
              paVar1->prefix[1] = (char)(uVar4 >> 0x28);
              paVar1->prefix[2] = (char)(uVar4 >> 0x30);
              paVar1->prefix[3] = (char)(uVar4 >> 0x38);
              *ppcVar10 = pcVar7;
            }
            ppcVar10 = ppcVar10 + 2;
          }
        }
      }
      uVar8 = uVar5;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}